

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  
  Align(this,other);
  iVar1 = other->exponent_;
  iVar2 = this->exponent_;
  iVar7 = 0;
  if (other->used_digits_ < 1) {
    bVar9 = true;
    lVar5 = 0;
  }
  else {
    lVar6 = (long)iVar1 - (long)iVar2;
    puVar4 = (other->bigits_).start_;
    puVar3 = (this->bigits_).start_;
    lVar5 = 0;
    do {
      uVar8 = (iVar7 + puVar3[lVar6 + lVar5]) - puVar4[lVar5];
      puVar3[lVar6 + lVar5] = uVar8 & 0xfffffff;
      iVar7 = (int)uVar8 >> 0x1f;
      lVar5 = lVar5 + 1;
    } while (lVar5 < other->used_digits_);
    bVar9 = -1 < (int)uVar8;
  }
  if (!bVar9) {
    puVar4 = (this->bigits_).start_ + ((lVar5 + iVar1) - (long)iVar2);
    do {
      uVar8 = *puVar4;
      *puVar4 = uVar8 - 1 & 0xfffffff;
      puVar4 = puVar4 + 1;
    } while ((int)(uVar8 - 1) < 0);
  }
  lVar5 = (long)this->used_digits_;
  if (0 < lVar5) {
    puVar4 = (this->bigits_).start_;
    do {
      if (puVar4[lVar5 + -1] != 0) goto LAB_0027c858;
      this->used_digits_ = (int)lVar5 + -1;
      bVar9 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar9);
    lVar5 = 0;
  }
LAB_0027c858:
  if ((int)lVar5 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  ASSERT(LessEqual(other, *this));

  Align(other);

  int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_digits_; ++i) {
    ASSERT((borrow == 0) || (borrow == 1));
    Chunk difference = bigits_[i + offset] - other.bigits_[i] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    Chunk difference = bigits_[i + offset] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}